

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

ion_err_t dictionary_close(ion_dictionary_t *dictionary)

{
  uint uVar1;
  ion_dictionary_parent_t *piVar2;
  code *pcVar3;
  ion_dictionary_compare_t p_Var4;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var5;
  ion_key_t pvVar6;
  ion_err_t iVar7;
  ion_err_t iVar8;
  byte bVar9;
  ion_err_t iVar10;
  undefined1 *puVar11;
  ion_status_t iVar12;
  ulong uVar13;
  ion_value_t pvVar14;
  ion_key_size_t extraout_EDX;
  undefined1 *puVar15;
  ion_key_t pvVar16;
  bool bVar17;
  long alStack_f0 [3];
  undefined1 local_d8 [8];
  ion_predicate_t predicate;
  ion_dictionary_handler_t fallback_handler;
  ion_dictionary_t fallback_dict;
  undefined1 *local_48;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  
  if (dictionary->status == '\x01') {
    iVar7 = '\0';
  }
  else {
    alStack_f0[2] = 0x106031;
    iVar7 = (*dictionary->handler->close_dictionary)(dictionary);
    if (iVar7 == '\x0f') {
      record.value = (ion_value_t)0x0;
      alStack_f0[2] = 0x106060;
      dictionary_build_predicate((ion_predicate_t *)local_d8,'\x02');
      alStack_f0[2] = 0x106070;
      iVar8 = (*dictionary->handler->find)
                        (dictionary,(ion_predicate_t *)local_d8,(ion_dict_cursor_t **)&record.value)
      ;
      if (iVar8 == '\0') {
        piVar2 = dictionary->instance;
        pvVar14 = (ion_value_t)(long)(piVar2->record).key_size;
        pvVar16 = (ion_key_t)(ulong)piVar2->key_type;
        local_48 = local_d8 + -((long)pvVar14 + 0xfU & 0xfffffffffffffff0);
        puVar11 = local_48 + -((long)(piVar2->record).value_size + 0xfU & 0xfffffffffffffff0);
        record.key = puVar11;
        *(undefined8 *)(puVar11 + -8) = 0x1060c8;
        ffdict_init((ion_dictionary_handler_t *)&predicate.destroy);
        uVar1 = dictionary->instance->id;
        *(_func_ion_err_t_ion_dictionary_t_ptr ***)(puVar11 + -8) =
             &fallback_handler.close_dictionary;
        *(_func_void_ion_predicate_t_ptr_ptr ***)(puVar11 + -0x10) = &predicate.destroy;
        *(undefined8 *)(puVar11 + -0x18) = 0x106115;
        iVar12 = (*fallback_handler.insert)((ion_dictionary_t *)(ulong)uVar1,pvVar16,pvVar14);
        iVar8 = iVar12.error;
        if (iVar8 == '\0') {
          *(uint *)(fallback_dict._0_8_ + 0x18) = uVar1;
          fallback_handler.close_dictionary._0_1_ = 0;
          do {
            pvVar14 = record.value;
            pcVar3 = *(code **)((long)record.value + 0x18);
            *(undefined8 *)(puVar11 + -8) = 0x106146;
            bVar9 = (*pcVar3)(pvVar14,&local_48);
            pvVar6 = record.key;
            puVar15 = local_48;
            if ((bVar9 != 4) && (bVar9 != 2)) {
              if ((bVar9 & 0xfd) == 1) {
                pcVar3 = *(code **)((long)record.value + 0x20);
                *(undefined8 *)(puVar11 + -8) = 0x10619a;
                (*pcVar3)();
                *(undefined8 *)(puVar11 + -8) = 0x1061a3;
                iVar8 = dictionary_close((ion_dictionary_t *)&fallback_handler.close_dictionary);
                if (iVar8 != '\0') goto LAB_00106074;
                p_Var5 = dictionary->handler->delete_dictionary;
                *(undefined8 *)(puVar11 + -8) = 0x1061b8;
                iVar10 = (*p_Var5)(dictionary);
                bVar17 = iVar10 == '\0';
                if (bVar17) {
                  iVar7 = '\0';
                }
                iVar8 = (ion_err_t)pvVar16;
                if (!bVar17) {
                  iVar8 = iVar10;
                }
                goto LAB_001061db;
              }
              iVar8 = '\x12';
              break;
            }
            pcVar3 = *(code **)fallback_dict.instance;
            *(undefined8 *)(puVar11 + -8) = 0x106163;
            uVar13 = (*pcVar3)(&fallback_handler.close_dictionary,puVar15,pvVar6);
            if ((char)uVar13 != '\0') {
              pcVar3 = *(code **)((long)record.value + 0x20);
              *(undefined8 *)(puVar11 + -8) = 0x106176;
              (*pcVar3)(&record.value);
              p_Var4 = fallback_dict.instance[1].compare;
              *(undefined8 *)(puVar11 + -8) = 0x106180;
              (*p_Var4)(&fallback_handler.close_dictionary,puVar15,extraout_EDX);
              pvVar16 = (ion_key_t)(uVar13 & 0xffffffff);
            }
            iVar8 = (ion_err_t)pvVar16;
          } while ((char)uVar13 == '\0');
        }
        bVar17 = false;
      }
      else {
LAB_00106074:
        bVar17 = false;
      }
LAB_001061db:
      if (!bVar17) {
        return iVar8;
      }
    }
    if (iVar7 == '\0') {
      dictionary->status = '\x01';
    }
  }
  return iVar7;
}

Assistant:

ion_err_t
dictionary_close(
	ion_dictionary_t *dictionary
) {
	if (ion_dictionary_status_closed == dictionary->status) {
		return err_ok;
	}

	ion_err_t error = dictionary->handler->close_dictionary(dictionary);

	if (err_not_implemented == error) {
		ion_predicate_t		predicate;
		ion_dict_cursor_t	*cursor = NULL;
		ion_record_t		record;
		ion_err_t			err;

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(dictionary, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		int				key_size	= dictionary->instance->record.key_size;
		int				value_size	= dictionary->instance->record.value_size;
		ion_key_type_t	key_type	= dictionary->instance->key_type;

		record.key		= alloca(key_size);
		record.value	= alloca(value_size);

		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;

		ffdict_init(&fallback_handler);

		err = dictionary_create(&fallback_handler, &fallback_dict, dictionary->instance->id, key_type, key_size, value_size, 1);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(&fallback_dict, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_delete_dictionary(&fallback_dict);
				return status.error;
			}
		}

		/* Cursor has either reached the end of the result set or there was no
		   result set to traverse, and the cursor remains uninitialized. */
		if ((cs_end_of_results != cursor_status) && (cs_cursor_uninitialized != cursor_status)) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_close(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status = ion_dictionary_status_closed;
	}

	return error;
}